

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O1

void crypto::xchacha20::run_rounds(word *keystream)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  word wVar9;
  uint uVar10;
  word wVar11;
  uint uVar12;
  uint uVar13;
  word wVar14;
  uint uVar15;
  word wVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  word wVar20;
  uint uVar21;
  word wVar22;
  uint uVar23;
  uint uVar24;
  word wVar25;
  word local_50;
  word local_4c;
  
  uVar2 = keystream[4];
  local_4c = *keystream;
  uVar6 = keystream[1];
  wVar20 = keystream[0xc];
  uVar1 = keystream[8];
  uVar3 = keystream[5];
  uVar5 = keystream[0xd];
  local_50 = keystream[9];
  wVar9 = keystream[6];
  wVar11 = keystream[2];
  wVar14 = keystream[0xe];
  uVar4 = keystream[10];
  uVar24 = keystream[7];
  wVar22 = keystream[3];
  wVar25 = keystream[0xf];
  wVar16 = keystream[0xb];
  lVar8 = 10;
  do {
    uVar17 = wVar20 ^ local_4c + uVar2;
    uVar18 = uVar17 << 0x10 | uVar17 >> 0x10;
    uVar1 = uVar1 + uVar18;
    uVar17 = uVar2 ^ uVar1;
    uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
    uVar7 = local_4c + uVar2 + uVar17;
    uVar18 = uVar18 ^ uVar7;
    uVar19 = uVar18 << 8 | uVar18 >> 0x18;
    uVar1 = uVar1 + uVar19;
    uVar17 = uVar17 ^ uVar1;
    uVar2 = uVar17 << 7 | uVar17 >> 0x19;
    uVar5 = uVar5 ^ uVar6 + uVar3;
    uVar17 = uVar5 << 0x10 | uVar5 >> 0x10;
    uVar18 = local_50 + uVar17;
    uVar5 = uVar3 ^ uVar18;
    uVar5 = uVar5 << 0xc | uVar5 >> 0x14;
    uVar6 = uVar6 + uVar3 + uVar5;
    uVar17 = uVar17 ^ uVar6;
    uVar17 = uVar17 << 8 | uVar17 >> 0x18;
    uVar18 = uVar18 + uVar17;
    uVar5 = uVar5 ^ uVar18;
    uVar3 = uVar5 << 7 | uVar5 >> 0x19;
    uVar5 = wVar14 ^ wVar11 + wVar9;
    uVar12 = uVar5 << 0x10 | uVar5 >> 0x10;
    uVar4 = uVar4 + uVar12;
    uVar5 = wVar9 ^ uVar4;
    uVar5 = uVar5 << 0xc | uVar5 >> 0x14;
    uVar10 = wVar11 + wVar9 + uVar5;
    uVar12 = uVar12 ^ uVar10;
    uVar13 = uVar12 << 8 | uVar12 >> 0x18;
    uVar4 = uVar4 + uVar13;
    uVar5 = uVar5 ^ uVar4;
    uVar12 = uVar5 << 7 | uVar5 >> 0x19;
    uVar5 = wVar25 ^ wVar22 + uVar24;
    uVar23 = uVar5 << 0x10 | uVar5 >> 0x10;
    uVar15 = wVar16 + uVar23;
    uVar5 = uVar24 ^ uVar15;
    uVar5 = uVar5 << 0xc | uVar5 >> 0x14;
    uVar21 = wVar22 + uVar24 + uVar5;
    uVar23 = uVar23 ^ uVar21;
    uVar24 = uVar23 << 8 | uVar23 >> 0x18;
    uVar15 = uVar15 + uVar24;
    uVar5 = uVar5 ^ uVar15;
    uVar5 = uVar5 << 7 | uVar5 >> 0x19;
    uVar7 = uVar7 + uVar3;
    uVar24 = uVar24 ^ uVar7;
    uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
    uVar4 = uVar4 + uVar24;
    uVar3 = uVar3 ^ uVar4;
    uVar3 = uVar3 << 0xc | uVar3 >> 0x14;
    local_4c = uVar7 + uVar3;
    uVar24 = uVar24 ^ local_4c;
    wVar25 = uVar24 << 8 | uVar24 >> 0x18;
    uVar4 = uVar4 + wVar25;
    uVar3 = uVar3 ^ uVar4;
    uVar3 = uVar3 << 7 | uVar3 >> 0x19;
    uVar6 = uVar6 + uVar12;
    uVar19 = uVar19 ^ uVar6;
    uVar7 = uVar19 << 0x10 | uVar19 >> 0x10;
    uVar15 = uVar15 + uVar7;
    uVar12 = uVar12 ^ uVar15;
    uVar24 = uVar12 << 0xc | uVar12 >> 0x14;
    uVar6 = uVar6 + uVar24;
    uVar7 = uVar7 ^ uVar6;
    wVar20 = uVar7 << 8 | uVar7 >> 0x18;
    wVar16 = uVar15 + wVar20;
    uVar24 = uVar24 ^ wVar16;
    wVar9 = uVar24 << 7 | uVar24 >> 0x19;
    uVar10 = uVar10 + uVar5;
    uVar17 = uVar17 ^ uVar10;
    uVar17 = uVar17 << 0x10 | uVar17 >> 0x10;
    uVar1 = uVar1 + uVar17;
    uVar5 = uVar5 ^ uVar1;
    uVar24 = uVar5 << 0xc | uVar5 >> 0x14;
    wVar11 = uVar10 + uVar24;
    uVar17 = uVar17 ^ wVar11;
    uVar5 = uVar17 << 8 | uVar17 >> 0x18;
    uVar1 = uVar1 + uVar5;
    uVar24 = uVar24 ^ uVar1;
    uVar24 = uVar24 << 7 | uVar24 >> 0x19;
    uVar21 = uVar21 + uVar2;
    uVar13 = uVar13 ^ uVar21;
    uVar17 = uVar13 << 0x10 | uVar13 >> 0x10;
    uVar18 = uVar18 + uVar17;
    uVar2 = uVar2 ^ uVar18;
    uVar2 = uVar2 << 0xc | uVar2 >> 0x14;
    wVar22 = uVar21 + uVar2;
    uVar17 = uVar17 ^ wVar22;
    wVar14 = uVar17 << 8 | uVar17 >> 0x18;
    local_50 = uVar18 + wVar14;
    uVar2 = uVar2 ^ local_50;
    uVar2 = uVar2 << 7 | uVar2 >> 0x19;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  keystream[4] = uVar2;
  *keystream = local_4c;
  keystream[0xc] = wVar20;
  keystream[8] = uVar1;
  keystream[5] = uVar3;
  keystream[1] = uVar6;
  keystream[0xd] = uVar5;
  keystream[9] = local_50;
  keystream[6] = wVar9;
  keystream[2] = wVar11;
  keystream[0xe] = wVar14;
  keystream[10] = uVar4;
  keystream[7] = uVar24;
  keystream[3] = wVar22;
  keystream[0xf] = wVar25;
  keystream[0xb] = wVar16;
  return;
}

Assistant:

void xchacha20::run_rounds(word keystream[16]) {
	
	#define CHACHA20_QR(a, b, c, d) \
		a += b; \
		d = d ^ a; \
		d = util::rotl_fixed(d, 16); \
		c += d; \
		b = b ^ c; \
		b = util::rotl_fixed(b, 12); \
		a += b; \
		d = d ^ a; \
		d = util::rotl_fixed(d, 8); \
		c += d; \
		b = b ^ c; \
		b = util::rotl_fixed(b, 7);
	
	for(size_t i = 0; i < 10; i++) {
		CHACHA20_QR(keystream[0], keystream[4], keystream[8], keystream[12]);  // column 0
		CHACHA20_QR(keystream[1], keystream[5], keystream[9], keystream[13]);  // column 1
		CHACHA20_QR(keystream[2], keystream[6], keystream[10], keystream[14]); // column 2
		CHACHA20_QR(keystream[3], keystream[7], keystream[11], keystream[15]); // column 3
		CHACHA20_QR(keystream[0], keystream[5], keystream[10], keystream[15]); // diagonal 1 (main diagonal)
		CHACHA20_QR(keystream[1], keystream[6], keystream[11], keystream[12]); // diagonal 2
		CHACHA20_QR(keystream[2], keystream[7], keystream[8], keystream[13]);  // diagonal 3
		CHACHA20_QR(keystream[3], keystream[4], keystream[9], keystream[14]);  // diagonal 4
	}
	
	#undef CHACHA20_QR
	
}